

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O0

void av1_fwd_txfm2d_16x4_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  int8_t *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  __m128i *in_00;
  byte in_CL;
  __m128i *in_RSI;
  __m128i *cur_in;
  int i;
  int lr_flip;
  int ud_flip;
  fwd_transform_1d_sse4_1 row_txfm;
  fwd_transform_1d_sse4_1 col_txfm;
  int bitrow;
  int bitcol;
  int txfm_size_row;
  int txfm_size_col;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  __m128i *outcoeff128;
  __m128i in [16];
  int local_16c;
  int in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  fwd_transform_1d_sse4_1 p_Var5;
  __m128i *out;
  longlong local_128 [34];
  byte local_15;
  
  piVar1 = av1_fwd_txfm_shift_ls[0xe];
  local_15 = in_CL;
  iVar2 = get_txw_idx('\x0e');
  iVar3 = get_txh_idx('\x0e');
  iVar4 = (int)av1_fwd_cos_bit_col[iVar2][iVar3];
  iVar2 = (int)av1_fwd_cos_bit_row[iVar2][iVar3];
  out = (__m128i *)col_highbd_txfm4x4_arr[local_15];
  p_Var5 = row_highbd_txfm8x16_arr[local_15];
  get_flip_cfg(local_15,(int *)&stack0xfffffffffffffe9c,(int *)&stack0xfffffffffffffe98);
  load_buffer_16x4((int16_t *)CONCAT44(iVar4,iVar2),out,(int)((ulong)p_Var5 >> 0x20),(int)p_Var5,
                   in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98);
  for (local_16c = 0; local_16c < 4; local_16c = local_16c + 1) {
    in_00 = (__m128i *)(local_128 + (long)(local_16c << 2) * 2);
    (*(code *)out)(in_00,in_00,iVar4,1);
    transpose_32bit_4x4(in_00,in_00);
  }
  col_txfm_8x8_rounding((__m128i *)local_128,-(int)piVar1[1]);
  (*p_Var5)((__m128i *)local_128,in_RSI,iVar2,1);
  return;
}

Assistant:

void av1_fwd_txfm2d_16x4_sse4_1(const int16_t *input, int32_t *coeff,
                                int stride, TX_TYPE tx_type, int bd) {
  __m128i in[16];
  __m128i *outcoeff128 = (__m128i *)coeff;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_16X4];
  const int txw_idx = get_txw_idx(TX_16X4);
  const int txh_idx = get_txh_idx(TX_16X4);
  const int txfm_size_col = tx_size_wide[TX_16X4];
  const int txfm_size_row = tx_size_high[TX_16X4];
  int bitcol = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int bitrow = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const fwd_transform_1d_sse4_1 col_txfm = col_highbd_txfm4x4_arr[tx_type];
  const fwd_transform_1d_sse4_1 row_txfm = row_highbd_txfm8x16_arr[tx_type];
  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);

  // col transform
  load_buffer_16x4(input, in, stride, ud_flip, lr_flip, shift[0]);

  for (int i = 0; i < (txfm_size_col >> 2); i++) {
    __m128i *cur_in = &in[i * txfm_size_row];
    col_txfm(cur_in, cur_in, bitcol, 1);
    transpose_32bit_4x4(cur_in, cur_in);
  }
  col_txfm_8x8_rounding(in, -shift[1]);

  // row transform
  row_txfm(in, outcoeff128, bitrow, 1);
  (void)bd;
}